

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlElement.cpp
# Opt level: O0

int libebml::CodedValueLengthSigned(int64 Length,int CodedSize,binary *OutBuffer)

{
  int iVar1;
  binary *OutBuffer_local;
  uint64 uStack_10;
  int CodedSize_local;
  int64 Length_local;
  
  if ((Length < -0x3f) || (0x3f < Length)) {
    if ((Length < -0x1fff) || (0x1fff < Length)) {
      if ((Length < -0xfffff) || (0xfffff < Length)) {
        uStack_10 = Length;
        if ((-0x8000000 < Length) && (Length < 0x8000000)) {
          uStack_10 = Length + 0x7ffffff;
        }
      }
      else {
        uStack_10 = Length + 0xfffff;
      }
    }
    else {
      uStack_10 = Length + 0x1fff;
    }
  }
  else {
    uStack_10 = Length + 0x3f;
  }
  iVar1 = CodedValueLength(uStack_10,CodedSize,OutBuffer);
  return iVar1;
}

Assistant:

int CodedValueLengthSigned(int64 Length, int CodedSize, binary * OutBuffer)
{
  if (Length > -64 && Length < 64) // 2^6
    Length += 63;
  else if (Length > -8192 && Length < 8192) // 2^13
    Length += 8191;
  else if (Length > -1048576L && Length < 1048576L) // 2^20
    Length += 1048575L;
  else if (Length > -134217728L && Length < 134217728L) // 2^27
    Length += 134217727L;

  return CodedValueLength(Length, CodedSize, OutBuffer);
}